

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

tchar SkipWhite(TidyConfigImpl *config)

{
  Bool BVar1;
  uint c;
  
  c = config->c;
  while( true ) {
    BVar1 = prvTidyIsWhite(c);
    if (BVar1 == no) break;
    BVar1 = prvTidyIsNewline(config->c);
    if (BVar1 != no) break;
    if (config->cfgIn == (StreamIn *)0x0) {
      c = 0xffffffff;
    }
    else {
      c = prvTidyReadChar(config->cfgIn);
    }
    config->c = c;
  }
  return config->c;
}

Assistant:

static tchar SkipWhite( TidyConfigImpl* config )
{
    while ( TY_(IsWhite)(config->c) && !TY_(IsNewline)(config->c) )
        config->c = GetC( config );
    return config->c;
}